

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optional-main.t.hpp
# Opt level: O1

ostream * lest::operator<<(ostream *os,optional<int> *v)

{
  bool bVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  ostream *poVar3;
  int *value;
  size_type *psVar4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_80;
  size_type local_78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_70;
  string local_60;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_40;
  size_type local_38;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_30;
  
  std::__ostream_insert<char,std::char_traits<char>>(os,"[optional:",10);
  bVar1 = v->has_value_;
  if (bVar1 == true) {
    string_maker<int>::to_string_abi_cxx11_(&local_60,(string_maker<int> *)&v->contained,value);
    paVar2 = &local_70;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p == &local_60.field_2) {
      local_70._8_8_ = local_60.field_2._8_8_;
      local_80 = paVar2;
    }
    else {
      local_80 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)local_60._M_dataplus._M_p;
    }
    local_70._M_allocated_capacity = local_60.field_2._M_allocated_capacity;
    local_78 = local_60._M_string_length;
    local_40 = &local_30;
    if (local_80 == paVar2) {
      local_30._8_8_ = local_70._8_8_;
    }
    else {
      local_40 = local_80;
    }
    local_30._M_allocated_capacity = local_60.field_2._M_allocated_capacity;
    psVar4 = &local_78;
  }
  else {
    local_80 = &local_70;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"[empty]","");
    local_30._M_allocated_capacity = local_70._M_allocated_capacity;
    paVar2 = &local_60.field_2;
    if (local_80 == &local_70) {
      local_60.field_2._8_8_ = local_70._8_8_;
      local_60._M_dataplus._M_p = (pointer)paVar2;
    }
    else {
      local_60._M_dataplus._M_p = (pointer)local_80;
    }
    local_60._M_string_length = local_78;
    local_78 = 0;
    local_70._M_allocated_capacity = local_70._M_allocated_capacity & 0xffffffffffffff00;
    local_40 = &local_30;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p == paVar2) {
      local_30._8_8_ = local_60.field_2._8_8_;
    }
    else {
      local_40 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)local_60._M_dataplus._M_p;
    }
    psVar4 = &local_60._M_string_length;
    local_80 = &local_70;
  }
  local_38 = local_60._M_string_length;
  local_60.field_2._M_allocated_capacity = local_30._M_allocated_capacity;
  (((string *)(psVar4 + -1))->_M_dataplus)._M_p = (pointer)paVar2;
  *psVar4 = 0;
  paVar2->_M_local_buf[0] = '\0';
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>(os,local_40->_M_local_buf,local_38);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"]",1);
  if (local_40 != &local_30) {
    operator_delete(local_40,local_30._M_allocated_capacity + 1);
  }
  if ((bVar1 == false) &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2)) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  if (local_80 != &local_70) {
    operator_delete(local_80,local_70._M_allocated_capacity + 1);
  }
  return poVar3;
}

Assistant:

inline std::ostream & operator<<( std::ostream & os, nonstd::optional<T> const & v )
{
    using lest::to_string;
    return os << "[optional:" << (v ? to_string(*v) : "[empty]") << "]";
}